

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O0

bool run_test_type_conversion<std::reference_wrapper<bool>const&>(Boxed_Value *bv,bool expectedpass)

{
  bool *__uref;
  bad_boxed_cast *e;
  exception *e_1;
  reference_wrapper<bool> local_30;
  reference_wrapper<bool> *local_28;
  reference_wrapper<bool> *ret;
  Boxed_Value *pBStack_18;
  bool expectedpass_local;
  Boxed_Value *bv_local;
  
  ret._7_1_ = expectedpass;
  pBStack_18 = bv;
  __uref = chaiscript::boxed_cast<std::reference_wrapper<bool>const&>
                     (bv,(Type_Conversions_State *)0x0);
  std::reference_wrapper<bool>::reference_wrapper<bool&,void,bool*>(&local_30,__uref);
  local_28 = &local_30;
  use<std::reference_wrapper<bool>>(local_30);
  return (bool)(ret._7_1_ & 1);
}

Assistant:

bool run_test_type_conversion(const Boxed_Value &bv, bool expectedpass) {
  try {
    To ret = chaiscript::boxed_cast<To>(bv);
    use(ret);
  } catch (const chaiscript::exception::bad_boxed_cast &e) {
    if (expectedpass) {
      std::cerr << "Failure in run_test_type_conversion: " << e.what() << '\n';
      return false;
    }
    return true;
  } catch (const std::exception &e) {
    std::cerr << "Unexpected standard exception when attempting cast_conversion: " << e.what() << '\n';
    return false;
  } catch (...) {
    std::cerr << "Unexpected unknown exception when attempting cast_conversion.\n";
    return false;
  }

  return expectedpass;
}